

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

void __thiscall HPack::FieldLookupTable::clearDynamicTable(FieldLookupTable *this)

{
  std::
  _Rb_tree<HPack::FieldLookupTable::SearchEntry,_HPack::FieldLookupTable::SearchEntry,_std::_Identity<HPack::FieldLookupTable::SearchEntry>,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
  ::clear(&(this->searchIndex)._M_t);
  std::
  deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  ::clear(&this->chunks);
  this->nDynamic = 0;
  this->begin = 0;
  this->end = 0;
  this->dataSize = 0;
  return;
}

Assistant:

void FieldLookupTable::clearDynamicTable()
{
    searchIndex.clear();
    chunks.clear();
    begin = 0;
    end = 0;
    nDynamic = 0;
    dataSize = 0;
}